

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void chebyshev2_set(int n,double *x,double *w)

{
  ostream *poVar1;
  
  switch(n) {
  case 1:
    *x = 0.0;
    *w = 1.570796326794897;
    break;
  case 2:
    *x = -0.5;
    x[1] = 0.5;
    *w = 0.7853981633974484;
    w[1] = 0.7853981633974481;
    break;
  case 3:
    *x = -0.7071067811865475;
    x[1] = 0.0;
    x[2] = 0.7071067811865476;
    *w = 0.3926990816987243;
    w[1] = 0.7853981633974483;
    w[2] = 0.392699081698724;
    break;
  case 4:
    *x = -0.8090169943749473;
    x[1] = -0.3090169943749473;
    x[2] = 0.3090169943749475;
    x[3] = 0.8090169943749475;
    *w = 0.2170787134227061;
    w[1] = 0.5683194499747424;
    w[2] = 0.5683194499747423;
    w[3] = 0.217078713422706;
    break;
  case 5:
    *x = -0.8660254037844387;
    x[1] = -0.5;
    x[2] = 0.0;
    x[3] = 0.5;
    x[4] = 0.8660254037844387;
    *w = 0.1308996938995747;
    w[1] = 0.3926990816987242;
    w[2] = 0.5235987755982988;
    w[3] = 0.392699081698724;
    w[4] = 0.1308996938995747;
    break;
  case 6:
    *x = -0.900968867902419;
    x[1] = -0.6234898018587335;
    x[2] = -0.2225209339563143;
    x[3] = 0.2225209339563144;
    x[4] = 0.6234898018587336;
    x[5] = 0.9009688679024191;
    *w = 0.08448869089158863;
    w[1] = 0.2743330560697779;
    w[2] = 0.4265764164360819;
    w[3] = 0.4265764164360819;
    w[4] = 0.2743330560697778;
    w[5] = 0.08448869089158857;
    break;
  case 7:
    *x = -0.9238795325112867;
    x[1] = -0.7071067811865475;
    x[2] = -0.3826834323650897;
    x[3] = 0.0;
    x[4] = 0.3826834323650898;
    x[5] = 0.7071067811865476;
    x[6] = 0.9238795325112867;
    *w = 0.05750944903191316;
    w[1] = 0.1963495408493621;
    w[2] = 0.335189632666811;
    w[3] = 0.3926990816987241;
    w[4] = 0.335189632666811;
    w[5] = 0.196349540849362;
    w[6] = 0.05750944903191313;
    break;
  case 8:
    *x = -0.9396926207859083;
    x[1] = -0.7660444431189779;
    x[2] = -0.5;
    x[3] = -0.1736481776669303;
    x[4] = 0.1736481776669304;
    x[5] = 0.5;
    x[6] = 0.766044443118978;
    x[7] = 0.9396926207859084;
    *w = 0.04083294770910712;
    w[1] = 0.1442256007956728;
    w[2] = 0.2617993877991495;
    w[3] = 0.338540227093519;
    w[4] = 0.338540227093519;
    w[5] = 0.2617993877991494;
    w[6] = 0.1442256007956727;
    w[7] = 0.04083294770910708;
    break;
  case 9:
    *x = -0.9510565162951535;
    x[1] = -0.8090169943749473;
    x[2] = -0.587785252292473;
    x[3] = -0.3090169943749473;
    x[4] = 0.0;
    x[5] = 0.3090169943749475;
    x[6] = 0.5877852522924731;
    x[7] = 0.8090169943749475;
    x[8] = 0.9510565162951535;
    *w = 0.02999954037160818;
    w[1] = 0.108539356711353;
    w[2] = 0.2056199086476263;
    w[3] = 0.2841597249873712;
    w[4] = 0.3141592653589793;
    w[5] = 0.2841597249873711;
    w[6] = 0.2056199086476263;
    w[7] = 0.108539356711353;
    w[8] = 0.02999954037160816;
    break;
  case 10:
    *x = -0.9594929736144974;
    x[1] = -0.8412535328311811;
    x[2] = -0.654860733945285;
    x[3] = -0.4154150130018863;
    x[4] = -0.142314838273285;
    x[5] = 0.1423148382732851;
    x[6] = 0.4154150130018864;
    x[7] = 0.6548607339452851;
    x[8] = 0.8412535328311812;
    x[9] = 0.9594929736144974;
    *w = 0.02266894250185884;
    w[1] = 0.08347854093418908;
    w[2] = 0.1631221774548166;
    w[3] = 0.2363135602034873;
    w[4] = 0.2798149423030966;
    w[5] = 0.2798149423030965;
    w[6] = 0.2363135602034873;
    w[7] = 0.1631221774548166;
    w[8] = 0.08347854093418902;
    w[9] = 0.02266894250185884;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CHEBYSHEV2_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 10.\n");
    exit(1);
  }
  return;
}

Assistant:

void chebyshev2_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV2_SET sets a Chebyshev Type 2 quadrature rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -1 <= x <= 1 ) f(x) * sqrt ( 1 - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w[i) * f ( x[i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    28 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be between 1 and 10.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] =   0.0;
    w[0] =    1.570796326794897;
  }
  else if ( n == 2 )
  {
    x[0] =  -0.5000000000000000;    
    x[1] =   0.5000000000000000;    
    w[0] =   0.7853981633974484;    
    w[1] =   0.7853981633974481; 
  }
  else if ( n == 3 )
  {   
    x[0] =  -0.7071067811865475;    
    x[1] =   0.0;
    x[2] =   0.7071067811865476;    
    w[0] =   0.3926990816987243;    
    w[1] =   0.7853981633974483;    
    w[2] =   0.3926990816987240;
  }
  else if ( n == 4 )
  {   
    x[0] =  -0.8090169943749473;    
    x[1] =  -0.3090169943749473;    
    x[2] =   0.3090169943749475;    
    x[3] =   0.8090169943749475;    
    w[0] =   0.2170787134227061;    
    w[1] =   0.5683194499747424;    
    w[2] =   0.5683194499747423;    
    w[3] =   0.2170787134227060;
  }
  else if ( n == 5 )
  {   
    x[0] =  -0.8660254037844387;   
    x[1] =  -0.5000000000000000;    
    x[2] =   0.0;
    x[3] =   0.5000000000000000;    
    x[4] =   0.8660254037844387;    
    w[0] =   0.1308996938995747;    
    w[1] =   0.3926990816987242;    
    w[2] =   0.5235987755982988;    
    w[3] =   0.3926990816987240;    
    w[4] =   0.1308996938995747;
  }
  else if ( n == 6 )
  {  
    x[0] =  -0.9009688679024190;    
    x[1] =  -0.6234898018587335;    
    x[2] =  -0.2225209339563143;    
    x[3] =   0.2225209339563144;    
    x[4] =   0.6234898018587336;    
    x[5] =   0.9009688679024191;    
    w[0] =   0.08448869089158863;
    w[1] =   0.2743330560697779;    
    w[2] =   0.4265764164360819;    
    w[3] =   0.4265764164360819;    
    w[4] =   0.2743330560697778;    
    w[5] =   0.08448869089158857;
  }
  else if ( n == 7 )
  {
    x[0] =  -0.9238795325112867;    
    x[1] =  -0.7071067811865475;    
    x[2] =  -0.3826834323650897;    
    x[3] =   0.0;
    x[4] =   0.3826834323650898;    
    x[5] =   0.7071067811865476;    
    x[6] =   0.9238795325112867;    
    w[0] =   0.05750944903191316;
    w[1] =   0.1963495408493621;    
    w[2] =   0.3351896326668110;    
    w[3] =   0.3926990816987241;    
    w[4] =   0.3351896326668110;    
    w[5] =   0.1963495408493620;    
    w[6] =   0.05750944903191313;
  }
  else if ( n == 8 )
  {
    x[0] =  -0.9396926207859083;    
    x[1] =  -0.7660444431189779;    
    x[2] =  -0.5000000000000000;    
    x[3] =  -0.1736481776669303;    
    x[4] =   0.1736481776669304;    
    x[5] =   0.5000000000000000;    
    x[6] =   0.7660444431189780;    
    x[7] =   0.9396926207859084;    
    w[0] =   0.04083294770910712;
    w[1] =   0.1442256007956728;    
    w[2] =   0.2617993877991495;    
    w[3] =   0.3385402270935190;    
    w[4] =   0.3385402270935190;    
    w[5] =   0.2617993877991494;    
    w[6] =   0.1442256007956727;    
    w[7] =   0.04083294770910708;
  }
  else if ( n == 9 )
  {
    x[0] =  -0.9510565162951535;    
    x[1] =  -0.8090169943749473;    
    x[2] =  -0.5877852522924730;    
    x[3] =  -0.3090169943749473;    
    x[4] =   0.0;
    x[5] =   0.3090169943749475;    
    x[6] =   0.5877852522924731;    
    x[7] =   0.8090169943749475;    
    x[8] =   0.9510565162951535;    
    w[0] =   0.02999954037160818;
    w[1] =   0.1085393567113530;    
    w[2] =   0.2056199086476263;    
    w[3] =   0.2841597249873712;    
    w[4] =   0.3141592653589793;    
    w[5] =   0.2841597249873711;    
    w[6] =   0.2056199086476263;    
    w[7] =   0.1085393567113530;    
    w[8] =   0.02999954037160816;
  }
  else if ( n == 10 )
  {
    x[0] =  -0.9594929736144974;    
    x[1] =  -0.8412535328311811;    
    x[2] =  -0.6548607339452850;    
    x[3] =  -0.4154150130018863;    
    x[4] =  -0.1423148382732850;    
    x[5] =   0.1423148382732851;    
    x[6] =   0.4154150130018864;    
    x[7] =   0.6548607339452851;    
    x[8] =   0.8412535328311812;    
    x[9] =   0.9594929736144974;    
    w[0] =   0.02266894250185884;
    w[1] =   0.08347854093418908;
    w[2] =   0.1631221774548166;    
    w[3] =   0.2363135602034873;    
    w[4] =   0.2798149423030966;    
    w[5] =   0.2798149423030965;    
    w[6] =   0.2363135602034873;    
    w[7] =   0.1631221774548166;    
    w[8] =   0.08347854093418902;
    w[9] =   0.02266894250185884;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "CHEBYSHEV2_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 10.\n";
    exit ( 1 );
  }

  return;
}